

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::CapturedStream::GetCapturedString_abi_cxx11_(CapturedStream *this)

{
  ostream *poVar1;
  int *in_RSI;
  string *in_RDI;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  char *in_stack_00000010;
  GTestLogSeverity in_stack_0000001c;
  GTestLog *in_stack_00000020;
  FILE *file;
  string *content;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  GTestLog local_1c;
  FILE *local_18;
  
  if (in_RSI[1] != -1) {
    fflush((FILE *)0x0);
    dup2(in_RSI[1],*in_RSI);
    close(in_RSI[1]);
    in_RSI[1] = -1;
  }
  std::__cxx11::string::c_str();
  local_18 = posix::FOpen(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (local_18 == (FILE *)0x0) {
    GTestLog::GTestLog(in_stack_00000020,in_stack_0000001c,in_stack_00000010,in_stack_0000000c);
    poVar1 = GTestLog::GetStream(&local_1c);
    poVar1 = std::operator<<(poVar1,"Failed to open tmp file ");
    poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 2));
    std::operator<<(poVar1," for capturing stream.");
    GTestLog::~GTestLog((GTestLog *)poVar1);
  }
  ReadEntireFile_abi_cxx11_((FILE *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  posix::FClose((FILE *)0x26fddb);
  return in_RDI;
}

Assistant:

std::string GetCapturedString() {
    if (uncaptured_fd_ != -1) {
      // Restores the original stream.
      fflush(nullptr);
      dup2(uncaptured_fd_, fd_);
      close(uncaptured_fd_);
      uncaptured_fd_ = -1;
    }

    FILE* const file = posix::FOpen(filename_.c_str(), "r");
    if (file == nullptr) {
      GTEST_LOG_(FATAL) << "Failed to open tmp file " << filename_
                        << " for capturing stream.";
    }
    const std::string content = ReadEntireFile(file);
    posix::FClose(file);
    return content;
  }